

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O1

sexp_conflict
sexp_bytevector_s16_native_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2)

{
  short sVar1;
  sexp psVar2;
  sexp psVar3;
  sexp_conflict psVar4;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 8)) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar4;
  }
  if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
    return psVar4;
  }
  if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
    return psVar4;
  }
  psVar3 = (sexp)((long)arg1 >> 1);
  psVar2 = psVar3;
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      psVar2 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
    }
    else {
      psVar2 = (sexp)0x0;
    }
  }
  if (-1 < (long)psVar2) {
    psVar2 = psVar3;
    if (((ulong)arg1 & 1) == 0) {
      if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
        psVar2 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
      }
      else {
        psVar2 = (sexp)0x0;
      }
    }
    if (psVar2 < (arg0->value).type.name) {
      if (((ulong)arg1 & 1) == 0) {
        if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
          psVar3 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
        }
        else {
          psVar3 = (sexp)0x0;
        }
      }
      if (((ulong)arg2 & 1) == 0) {
        if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
          sVar1 = (short)(arg2->value).flonum_bits[0] * (short)(arg2->value).uvector.length;
        }
        else {
          sVar1 = 0;
        }
      }
      else {
        sVar1 = (short)((long)arg2 >> 1);
      }
      *(short *)((long)&arg0->value + (long)(int)psVar3 + 8) = sVar1;
      return (sexp_conflict)0x43e;
    }
  }
  psVar4 = (sexp_conflict)
           sexp_user_exception_ls
                     (ctx,self,"assertion failed: (< -1 arg1 (bytevector-length arg0))",2,arg1,
                      (arg0->value).stack.length * 2 + 1);
  return psVar4;
}

Assistant:

sexp sexp_bytevector_s16_native_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_bytesp(arg0))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (!((-1 < sexp_sint_value(arg1)) && (sexp_sint_value(arg1) < sexp_bytes_length(arg0)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg1 (bytevector-length arg0))", 2, arg1, sexp_make_fixnum(sexp_bytes_length(arg0)));
  }
  res = ((bytevector_s16_native_set_x(sexp_bytes_data(arg0), sexp_sint_value(arg1), sexp_sint_value(arg2))), SEXP_VOID);
  return res;
}